

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestRunner.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3d6ae::TestTestRunnerFixtureReporterNotifiedOfFailedTests::RunImpl
          (TestTestRunnerFixtureReporterNotifiedOfFailedTests *this)

{
  TestDetails *details;
  TestRunnerFixtureReporterNotifiedOfFailedTestsHelper fixtureHelper;
  TestRunnerFixtureReporterNotifiedOfFailedTestsHelper local_890;
  
  details = &(this->super_Test).m_details;
  TestRunnerFixture::TestRunnerFixture(&local_890.super_TestRunnerFixture);
  local_890.m_details = details;
  UnitTest::ExecuteTest<(anonymous_namespace)::TestRunnerFixtureReporterNotifiedOfFailedTestsHelper>
            (&local_890,details);
  TestRunnerFixture::~TestRunnerFixture(&local_890.super_TestRunnerFixture);
  return;
}

Assistant:

TEST_FIXTURE(TestRunnerFixture, ReporterNotifiedOfFailedTests)
{
    MockTest test1("test", false, false, 2);
    MockTest test2("test", true, false);
    MockTest test3("test", false, false, 3);
    list.Add(&test1);
    list.Add(&test2);
    list.Add(&test3);

	runner.RunTestsIf(list, NULL, True(), 0);
    CHECK_EQUAL(2, reporter.summaryFailedTestCount);
}